

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConfigDeclarationSyntax *pCVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *unaff_RBX;
  BumpAllocator *unaff_R14;
  Token TVar2;
  Token TVar3;
  Token *in_stack_00000030;
  SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *in_stack_00000038;
  Token *in_stack_00000040;
  SyntaxList<slang::syntax::ConfigRuleSyntax> *in_stack_00000048;
  Token *in_stack_00000050;
  BumpAllocator *in_stack_00000058;
  Token *in_stack_00000060;
  BumpAllocator *in_stack_ffffffffffffff08;
  NamedBlockClauseSyntax *in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffffb8 [16];
  
  deepClone<slang::syntax::AttributeInstanceSyntax>
            (in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._0_8_);
  TVar2 = parsing::Token::deepClone(in_stack_00000060,in_stack_00000058);
  TVar3 = parsing::Token::deepClone(in_stack_00000060,in_stack_00000058);
  parsing::Token::deepClone(in_stack_00000060,in_stack_00000058);
  deepClone<slang::syntax::ParameterDeclarationStatementSyntax>
            ((SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *)TVar3.info,
             TVar3._0_8_);
  parsing::Token::deepClone(in_stack_00000060,in_stack_00000058);
  deepClone<slang::syntax::ConfigCellIdentifierSyntax>
            ((SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *)TVar3.info,TVar3._0_8_);
  parsing::Token::deepClone(in_stack_00000060,in_stack_00000058);
  deepClone<slang::syntax::ConfigRuleSyntax>
            ((SyntaxList<slang::syntax::ConfigRuleSyntax> *)TVar3.info,TVar3._0_8_);
  parsing::Token::deepClone(in_stack_00000060,in_stack_00000058);
  if (((Token *)((long)__fn + 0x150))->info != (Info *)0x0) {
    deepClone<slang::syntax::NamedBlockClauseSyntax>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConfigDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ConfigCellIdentifierSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ConfigRuleSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     (unaff_R14,unaff_RBX,(Token *)__fn,(Token *)__child_stack,(Token *)TVar2.info,
                      TVar2._0_8_,in_stack_00000030,in_stack_00000038,in_stack_00000040,
                      in_stack_00000048,in_stack_00000050,
                      (NamedBlockClauseSyntax **)in_stack_00000058);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConfigDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConfigDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.config.deepClone(alloc),
        node.name.deepClone(alloc),
        node.semi1.deepClone(alloc),
        *deepClone(node.localparams, alloc),
        node.design.deepClone(alloc),
        *deepClone(node.topCells, alloc),
        node.semi2.deepClone(alloc),
        *deepClone(node.rules, alloc),
        node.endconfig.deepClone(alloc),
        node.blockName ? deepClone(*node.blockName, alloc) : nullptr
    );
}